

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# whisper.cpp
# Opt level: O0

bool whisper_sequence_tokens_equal(whisper_sequence *a,whisper_sequence *b)

{
  int iVar1;
  size_type sVar2;
  size_type sVar3;
  const_reference pvVar4;
  vector<whisper_token_data,_std::allocator<whisper_token_data>_> *in_RSI;
  vector<whisper_token_data,_std::allocator<whisper_token_data>_> *in_RDI;
  int i;
  int local_1c;
  
  sVar2 = std::vector<whisper_token_data,_std::allocator<whisper_token_data>_>::size(in_RDI);
  sVar3 = std::vector<whisper_token_data,_std::allocator<whisper_token_data>_>::size(in_RSI);
  if (sVar2 == sVar3) {
    sVar2 = std::vector<whisper_token_data,_std::allocator<whisper_token_data>_>::size(in_RDI);
    local_1c = (int)sVar2;
    do {
      local_1c = local_1c + -1;
      if (local_1c < 0) {
        return true;
      }
      pvVar4 = std::vector<whisper_token_data,_std::allocator<whisper_token_data>_>::operator[]
                         (in_RDI,(long)local_1c);
      iVar1 = pvVar4->id;
      pvVar4 = std::vector<whisper_token_data,_std::allocator<whisper_token_data>_>::operator[]
                         (in_RSI,(long)local_1c);
    } while (iVar1 == pvVar4->id);
  }
  return false;
}

Assistant:

static bool whisper_sequence_tokens_equal(const whisper_sequence & a, const whisper_sequence & b) {
    if (a.tokens.size() != b.tokens.size()) {
        return false;
    }
    // sequences are more likely to diverge at the end
    for (int i = a.tokens.size() - 1; i >= 0; i--) {
        if (a.tokens[i].id != b.tokens[i].id) {
            return false;
        }
    }
    return true;
}